

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

pair<ParserProbModelXML::elm_type,_unsigned_int> __thiscall
ParserProbModelXML::GetParsedElement(ParserProbModelXML *this,string *name)

{
  const_iterator cVar1;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar2;
  EParse *this_00;
  long *plVar3;
  size_type *psVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
          ::find(&(this->_m_parsedElements)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->_m_parsedElements)._M_t._M_impl.super__Rb_tree_header) {
    pVar2.first = cVar1._M_node[2]._M_color;
    pVar2.second = *(uint *)&cVar1._M_node[2].field_0x4;
    return pVar2;
  }
  this_00 = (EParse *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Requested undefined variable \"",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_60._M_dataplus._M_p == psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar3[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
  }
  local_60._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  EParse::EParse(this_00,&local_60);
  __cxa_throw(this_00,&EParse::typeinfo,E::~E);
}

Assistant:

const std::pair<ParserProbModelXML::elm_type, Index> ParserProbModelXML::GetParsedElement(const std::string name) const
{
    map<string, pair<elm_type, Index> >::const_iterator it = _m_parsedElements.find(name);

    if(it == _m_parsedElements.end())
    {
        throw EParse("Requested undefined variable \"" + name + "\".");
    }

    return it->second;
}